

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

uint __thiscall ON_MeshComponentRef::GetMeshFace(ON_MeshComponentRef *this,ON_MeshFace **mesh_face)

{
  uint ngon_index;
  TYPE TVar1;
  ON_Mesh *this_00;
  bool bVar2;
  ON_MeshNgon *pOVar3;
  ON_MeshFace *pOVar4;
  uint *in_RCX;
  uint uVar5;
  
  this_00 = this->m_mesh;
  uVar5 = 0xffffffff;
  if (this_00 != (ON_Mesh *)0x0) {
    ngon_index = (this->m_mesh_ci).m_index;
    if (-1 < (long)(int)ngon_index) {
      TVar1 = (this->m_mesh_ci).m_type;
      if (TVar1 == mesh_ngon) {
        pOVar3 = ON_Mesh::Ngon(this_00,ngon_index);
        bVar2 = true;
        if (((pOVar3 != (ON_MeshNgon *)0x0) && (pOVar3->m_Fcount == 1)) &&
           (in_RCX = pOVar3->m_fi, in_RCX != (uint *)0x0)) {
          if (*in_RCX < (uint)(this->m_mesh->m_F).m_count) {
            *mesh_face = (this->m_mesh->m_F).m_a + *in_RCX;
            in_RCX = (uint *)(ulong)*pOVar3->m_fi;
            bVar2 = false;
          }
        }
        if (!bVar2) {
          return (uint)in_RCX;
        }
      }
      else if ((TVar1 == mesh_face) && ((int)ngon_index < (this_00->m_F).m_count)) {
        pOVar4 = (this_00->m_F).m_a + (int)ngon_index;
        uVar5 = ngon_index;
        goto LAB_00516c4c;
      }
    }
  }
  pOVar4 = (ON_MeshFace *)0x0;
LAB_00516c4c:
  *mesh_face = pOVar4;
  return uVar5;
}

Assistant:

unsigned int ON_MeshComponentRef::GetMeshFace(
  const ON_MeshFace*& mesh_face
  ) const
{
  if ( 0 != m_mesh && m_mesh_ci.m_index >= 0 )
  {
    switch(m_mesh_ci.m_type)
    {     
    case ON_COMPONENT_INDEX::mesh_face:
      if ( m_mesh_ci.m_index < m_mesh->m_F.Count() )
      {
        mesh_face = &m_mesh->m_F[m_mesh_ci.m_index];
        return (unsigned int)m_mesh_ci.m_index;
      }
      break;

    case ON_COMPONENT_INDEX::mesh_ngon:
      {
        const ON_MeshNgon* ngon = m_mesh->Ngon(m_mesh_ci.m_index);
        if ( 0 != ngon && 1 == ngon->m_Fcount && 0 != ngon->m_fi )
        {
          if ( ngon->m_fi[0] < m_mesh->m_F.UnsignedCount() )
          {
            mesh_face = &m_mesh->m_F[ngon->m_fi[0]];
            return ngon->m_fi[0];
          }
        }
      }
      break;
    
    default:
      break;
    }
  }

  mesh_face = 0;
  return ON_UNSET_UINT_INDEX;
}